

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void init_minq_luts(int *kf_low_m,int *kf_high_m,int *arfgf_low,int *arfgf_high,int *inter,int *rtc,
                   aom_bit_depth_t bit_depth)

{
  int iVar1;
  int i;
  long lVar2;
  double maxq;
  
  lVar2 = 0;
  do {
    maxq = av1_convert_qindex_to_q((int)lVar2,bit_depth);
    iVar1 = get_minq_index(maxq,1e-06,-0.0004,0.15,bit_depth);
    kf_low_m[lVar2] = iVar1;
    iVar1 = get_minq_index(maxq,2.1e-06,-0.00125,0.45,bit_depth);
    kf_high_m[lVar2] = iVar1;
    iVar1 = get_minq_index(maxq,1.5e-06,-0.0009,0.3,bit_depth);
    arfgf_low[lVar2] = iVar1;
    iVar1 = get_minq_index(maxq,2.1e-06,-0.00125,0.55,bit_depth);
    arfgf_high[lVar2] = iVar1;
    iVar1 = get_minq_index(maxq,2.71e-06,-0.00113,0.9,bit_depth);
    inter[lVar2] = iVar1;
    iVar1 = get_minq_index(maxq,2.71e-06,-0.00113,0.7,bit_depth);
    rtc[lVar2] = iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

static void init_minq_luts(int *kf_low_m, int *kf_high_m, int *arfgf_low,
                           int *arfgf_high, int *inter, int *rtc,
                           aom_bit_depth_t bit_depth) {
  int i;
  for (i = 0; i < QINDEX_RANGE; i++) {
    const double maxq = av1_convert_qindex_to_q(i, bit_depth);
    kf_low_m[i] = get_minq_index(maxq, 0.000001, -0.0004, 0.150, bit_depth);
    kf_high_m[i] = get_minq_index(maxq, 0.0000021, -0.00125, 0.45, bit_depth);
    arfgf_low[i] = get_minq_index(maxq, 0.0000015, -0.0009, 0.30, bit_depth);
    arfgf_high[i] = get_minq_index(maxq, 0.0000021, -0.00125, 0.55, bit_depth);
    inter[i] = get_minq_index(maxq, 0.00000271, -0.00113, 0.90, bit_depth);
    rtc[i] = get_minq_index(maxq, 0.00000271, -0.00113, 0.70, bit_depth);
  }
}